

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void av1_gop_setup_structure(AV1_COMP *cpi)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_RDI;
  FRAME_UPDATE_TYPE first_frame_update_type;
  int key_frame;
  FRAME_INFO *frame_info;
  TWO_PASS *twopass;
  GF_GROUP *gf_group;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  int in_stack_0000015c;
  FRAME_INFO *in_stack_00000160;
  RATE_CONTROL *in_stack_00000168;
  GF_GROUP *in_stack_00000170;
  TWO_PASS *in_stack_00000178;
  AV1_COMP *in_stack_00000180;
  FRAME_UPDATE_TYPE in_stack_000001c0;
  undefined4 local_3c;
  
  lVar1 = *in_RDI;
  lVar2 = *in_RDI;
  if (((int)in_RDI[0xc0f4] == 0) && (*(int *)((long)in_RDI + 0x42794) != -1)) {
    if (*(int *)((long)in_RDI + 0x42794) < *(int *)(lVar2 + 0xc54)) {
      local_3c = *(undefined4 *)((long)in_RDI + 0x42794);
    }
    else {
      local_3c = *(undefined4 *)(lVar2 + 0xc54);
    }
    *(undefined4 *)(lVar2 + 0xc54) = local_3c;
  }
  iVar3 = construct_multi_layer_gf_structure
                    (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
                     in_stack_00000160,in_stack_0000015c,in_stack_000001c0);
  *(int *)(lVar2 + 0x1a08) = iVar3;
  if (*(int *)(lVar2 + 0xc54) == 0) {
    set_ld_layer_depth((GF_GROUP *)(lVar2 + 400),*(int *)(lVar1 + 0xac60));
  }
  return;
}

Assistant:

void av1_gop_setup_structure(AV1_COMP *cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  const int key_frame = rc->frames_since_key == 0;
  FRAME_UPDATE_TYPE first_frame_update_type = ARF_UPDATE;

  if (key_frame) {
    first_frame_update_type = KF_UPDATE;
    if (cpi->oxcf.kf_max_pyr_height != -1) {
      gf_group->max_layer_depth_allowed = AOMMIN(
          cpi->oxcf.kf_max_pyr_height, gf_group->max_layer_depth_allowed);
    }
  } else if (!cpi->ppi->gf_state.arf_gf_boost_lst) {
    first_frame_update_type = GF_UPDATE;
  }

  gf_group->size = construct_multi_layer_gf_structure(
      cpi, twopass, gf_group, rc, frame_info, p_rc->baseline_gf_interval,
      first_frame_update_type);

  if (gf_group->max_layer_depth_allowed == 0)
    set_ld_layer_depth(gf_group, p_rc->baseline_gf_interval);
}